

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool __thiscall pugi::xml_node::set_name(xml_node *this,char_t *rhs,size_t size)

{
  char_t *in_RDX;
  uintptr_t in_RSI;
  unsigned_long *in_RDI;
  xml_node_type type_;
  undefined4 local_34;
  undefined4 in_stack_ffffffffffffffd8;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar1;
  
  if (*in_RDI == 0) {
    local_34 = 0;
  }
  else {
    local_34 = (uint)*(undefined8 *)*in_RDI & 0xf;
  }
  if (((local_34 == 2) || (local_34 == 6)) || (local_34 == 7)) {
    bVar1 = impl::(anonymous_namespace)::strcpy_insitu<char*,unsigned_long>
                      ((char **)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),in_RDI
                       ,in_RSI,in_RDX,CONCAT44(local_34,in_stack_ffffffffffffffd8));
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

PUGI_IMPL_FN bool xml_node::set_name(const char_t* rhs, size_t size)
	{
		xml_node_type type_ = _root ? PUGI_IMPL_NODETYPE(_root) : node_null;

		if (type_ != node_element && type_ != node_pi && type_ != node_declaration)
			return false;

		return impl::strcpy_insitu(_root->name, _root->header, impl::xml_memory_page_name_allocated_mask, rhs, size);
	}